

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::utf8_to_json_string(utf8 *this,string *src)

{
  byte c;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  json_utf8_exception *this_00;
  char32_t uc;
  ulong local_40;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  pcVar5 = (char *)operator_new(0x20);
  *(char **)pcVar5 = pcVar5 + 0x10;
  pcVar5[8] = '\0';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5[0xc] = '\0';
  pcVar5[0xd] = '\0';
  pcVar5[0xe] = '\0';
  pcVar5[0xf] = '\0';
  pcVar5[0x10] = '\0';
  *(char **)this = pcVar5;
  local_38._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__cxx11::string::reserve((ulong)pcVar5);
  local_40 = 0;
LAB_0011b06f:
  do {
    if (src->_M_string_length <= local_40) {
      return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )local_38._M_head_impl;
    }
    c = (src->_M_dataplus)._M_p[local_40];
    uc = (char32_t)c;
    local_40 = local_40 + 1;
    uVar4 = utf8_length(c);
    if (3 < uVar4 - 1) {
      this_00 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this_00,invalid_utf8_sequence_length_e,uVar4);
      __cxa_throw(this_00,&json_utf8_exception::typeinfo,std::exception::~exception);
    }
    switch(uVar4) {
    case 1:
      goto switchD_0011b0a5_caseD_1;
    case 2:
      bVar3 = next_char(src,&local_40);
      uVar4 = (c & 0x1f) << 6;
      goto LAB_0011b12b;
    case 3:
      bVar2 = next_char(src,&local_40);
      bVar3 = next_char(src,&local_40);
      uVar4 = (c & 0xf) << 0xc;
      break;
    case 4:
      bVar1 = next_char(src,&local_40);
      bVar2 = next_char(src,&local_40);
      bVar3 = next_char(src,&local_40);
      uVar4 = (bVar1 & 0x3f) << 0xc | (c & 7) << 0x12;
    }
    uVar4 = (bVar2 & 0x3f) << 6 | uVar4;
LAB_0011b12b:
    uc = bVar3 & 0x3f | uVar4;
    if (uVar4 < 0x100) {
switchD_0011b0a5_caseD_1:
      uVar4 = uc & 0xff;
      switch(uVar4) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_0011b154_caseD_b:
        std::__cxx11::string::push_back((char)pcVar5);
        goto LAB_0011b06f;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((uVar4 != 0x5c) && (uVar4 != 0x22)) goto switchD_0011b154_caseD_b;
      }
      std::__cxx11::string::append(pcVar5);
      goto LAB_0011b06f;
    }
    if (0xffff < uVar4) {
      add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38._M_head_impl,(uVar4 - 0x10000 >> 10) + L'\xd800');
      uc = (uint)(bVar3 & 0x3f) | uVar4 & 0x3ff | 0xdc00;
    }
    add_hex_string((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38._M_head_impl,uc);
  } while( true );
}

Assistant:

unique_ptr<string> utf8::utf8_to_json_string(const string &src)
{
    unique_ptr<string> res(new string);

    // We need at least the same number of characters as the source.
    res->reserve(src.size());

    size_t src_index = 0;

    while (src_index < src.size())
    {
        char32_t uc = src[src_index++] & 0xff;

        unsigned int l = utf8_length(uc);

        switch (l)
        {
        case 1:
            break;
        case 2:
            uc = ((uc << 6) & 0x7ff) | (next_char(src, src_index) & 0x3f);
            break;
        case 3:
            uc = ((uc << 12) & 0xffff) | ((next_char(src, src_index) << 6) & 0xfff);
            uc |= next_char(src, src_index) & 0x3f;
            break;
        case 4:
            uc = ((uc << 18) & 0x1fffff) | ((next_char(src, src_index) << 12) & 0x3ffff);
            uc |= (next_char(src, src_index) << 6) & 0xfff;
            uc |= next_char(src, src_index) & 0x3f;  
            break;
        default:
            throw json_utf8_exception(json_utf8_exception::invalid_utf8_sequence_length_e, l);
        }

        if (uc <= 0xff)
        {
            switch (uc)
            {
            case '"':
                *res += "\\\"";
                break;
            case '\\':
                *res += "\\\\";
                break;
            case '\b':
                *res += "\\b";
                break;
            case '\f':
                *res += "\\f";
                break;
            case '\n':
                *res += "\\n";
                break;
            case '\r':
                *res += "\\r";
                break;
            case '\t':
                *res += "\\t";
                break;
            default: 
                *res += static_cast<char>(uc);
            }
        }
        else if (uc <= 0xffff)
        {
            add_hex_string(res, uc);
        }
        else
        {
            uc -= 0x10000;
            add_hex_string(res, (uc >> 10) + 0xD800);
            add_hex_string(res, (uc & 0x3ff) + 0xDC00);
        }
    }

    return res;
}